

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GenericValue(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,int64_t i64)

{
  int64_t i64_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_local;
  
  memset(this,0,0x10);
  (this->data_).n = (Number)i64;
  (this->data_).f.flags = 0x96;
  if (i64 < 0) {
    if (-0x80000001 < i64) {
      (this->data_).f.flags = (this->data_).f.flags | 0x20;
    }
  }
  else {
    (this->data_).f.flags = (this->data_).f.flags | 0x116;
    if ((i64 & 0xffffffff00000000U) == 0) {
      (this->data_).f.flags = (this->data_).f.flags | 0x40;
    }
    if ((i64 & 0xffffffff80000000U) == 0) {
      (this->data_).f.flags = (this->data_).f.flags | 0x20;
    }
  }
  return;
}

Assistant:

explicit GenericValue(int64_t i64) CEREAL_RAPIDJSON_NOEXCEPT : data_() {
        data_.n.i64 = i64;
        data_.f.flags = kNumberInt64Flag;
        if (i64 >= 0) {
            data_.f.flags |= kNumberUint64Flag;
            if (!(static_cast<uint64_t>(i64) & CEREAL_RAPIDJSON_UINT64_C2(0xFFFFFFFF, 0x00000000)))
                data_.f.flags |= kUintFlag;
            if (!(static_cast<uint64_t>(i64) & CEREAL_RAPIDJSON_UINT64_C2(0xFFFFFFFF, 0x80000000)))
                data_.f.flags |= kIntFlag;
        }
        else if (i64 >= static_cast<int64_t>(CEREAL_RAPIDJSON_UINT64_C2(0xFFFFFFFF, 0x80000000)))
            data_.f.flags |= kIntFlag;
    }